

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

Timestamp *
google::protobuf::util::anon_unknown_0::CreateNormalized<google::protobuf::Timestamp>
          (Timestamp *__return_storage_ptr__,int64_t seconds,int32_t nanos)

{
  int iVar1;
  long lVar2;
  LogMessageFatal aLStack_28 [16];
  
  if (seconds - 0x3afff44180U < 0xffffffb68879c780) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
               ,0x31,0x56,
               "seconds >= TimeUtil::kTimestampMinSeconds && seconds <= TimeUtil::kTimestampMaxSeconds"
              );
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_28,0x30,"Timestamp seconds are outside of the valid range");
  }
  else {
    if (nanos + 0xc4653600U < 0x88ca6c01) {
      seconds = seconds + nanos / 1000000000;
      nanos = nanos % 1000000000;
    }
    lVar2 = (nanos >> 0x1f) + seconds;
    iVar1 = nanos + 1000000000;
    if (-1 < nanos) {
      iVar1 = nanos;
    }
    if ((0xffffffb68879c77f < lVar2 - 0x3afff44180U) && (-1 < iVar1)) {
      Timestamp::Timestamp(__return_storage_ptr__,(Arena *)0x0);
      (__return_storage_ptr__->field_0)._impl_.seconds_ = lVar2;
      (__return_storage_ptr__->field_0)._impl_.nanos_ = iVar1;
      return __return_storage_ptr__;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
               ,0x42,0xb4,
               "seconds >= TimeUtil::kTimestampMinSeconds && seconds <= TimeUtil::kTimestampMaxSeconds && nanos >= TimeUtil::kTimestampMinNanoseconds && nanos <= TimeUtil::kTimestampMaxNanoseconds"
              );
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_28,0x27,"Timestamp is outside of the valid range");
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

Timestamp CreateNormalized(int64_t seconds, int32_t nanos) {
  ABSL_DCHECK(seconds >= TimeUtil::kTimestampMinSeconds &&
              seconds <= TimeUtil::kTimestampMaxSeconds)
      << "Timestamp seconds are outside of the valid range";

  // Make sure nanos is in the range.
  if (nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    seconds += nanos / kNanosPerSecond;
    nanos = nanos % kNanosPerSecond;
  }
  // For Timestamp nanos should be in the range [0, 999999999]
  if (nanos < 0) {
    seconds -= 1;
    nanos += kNanosPerSecond;
  }

  ABSL_DCHECK(seconds >= TimeUtil::kTimestampMinSeconds &&
              seconds <= TimeUtil::kTimestampMaxSeconds &&
              nanos >= TimeUtil::kTimestampMinNanoseconds &&
              nanos <= TimeUtil::kTimestampMaxNanoseconds)
      << "Timestamp is outside of the valid range";
  Timestamp result;
  result.set_seconds(seconds);
  result.set_nanos(static_cast<int32_t>(nanos));
  return result;
}